

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_extract.cpp
# Opt level: O3

void __thiscall duckdb::UnionExtractBindData::~UnionExtractBindData(UnionExtractBindData *this)

{
  pointer pcVar1;
  
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__UnionExtractBindData_019a4930;
  LogicalType::~LogicalType(&this->type);
  pcVar1 = (this->key)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->key).field_2) {
    operator_delete(pcVar1);
  }
  FunctionData::~FunctionData(&this->super_FunctionData);
  operator_delete(this);
  return;
}

Assistant:

UnionExtractBindData(string key, idx_t index, LogicalType type)
	    : key(std::move(key)), index(index), type(std::move(type)) {
	}